

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O1

QLoggingCategory * lcDD(void)

{
  undefined1 extraout_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  
  if (lcDD()::category != '\0') {
    return (QLoggingCategory *)CONCAT71(in_register_00000001,lcDD()::category);
  }
  lcDD();
  return (QLoggingCategory *)CONCAT71(extraout_var,extraout_AL);
}

Assistant:

QDeviceDiscovery *QDeviceDiscovery::create(QDeviceTypes types, QObject *parent)
{
    qCDebug(lcDD) << "udev device discovery for type" << types;

    QDeviceDiscovery *helper = nullptr;
    struct udev *udev;

    udev = udev_new();
    if (udev) {
        helper = new QDeviceDiscoveryUDev(types, udev, parent);
    } else {
        qWarning("Failed to get udev library context");
    }

    return helper;
}